

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaK_goiffalse(FuncState *fs,expdesc *e)

{
  expkind eVar1;
  int local_1c;
  int pc;
  expdesc *e_local;
  FuncState *fs_local;
  
  luaK_dischargevars(fs,e);
  eVar1 = e->k;
  if ((eVar1 == VNIL) || (eVar1 == VFALSE)) {
    local_1c = -1;
  }
  else if (eVar1 == VJMP) {
    local_1c = (e->u).s.info;
  }
  else {
    local_1c = jumponcond(fs,e,1);
  }
  luaK_concat(fs,&e->t,local_1c);
  luaK_patchtohere(fs,e->f);
  e->f = -1;
  return;
}

Assistant:

static void luaK_goiffalse(FuncState*fs,expdesc*e){
int pc;
luaK_dischargevars(fs,e);
switch(e->k){
case VNIL:case VFALSE:{
pc=(-1);
break;
}
case VJMP:{
pc=e->u.s.info;
break;
}
default:{
pc=jumponcond(fs,e,1);
break;
}
}
luaK_concat(fs,&e->t,pc);
luaK_patchtohere(fs,e->f);
e->f=(-1);
}